

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::LPFwriteRow<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,double *p_lhs,double *p_rhs)

{
  double dVar1;
  ostream *poVar2;
  double *pdVar3;
  ostream *in_RSI;
  double *in_R8;
  double *in_R9;
  bool unaff_retaddr;
  
  LPFwriteSVector<double>
            ((SPxLPBase<double> *)p_cnames,(ostream *)p_svec,(NameSet *)p_lhs,
             (SVectorBase<double> *)p_rhs,unaff_retaddr);
  if ((*in_R8 != *in_R9) || (NAN(*in_R8) || NAN(*in_R9))) {
    dVar1 = *in_R8;
    pdVar3 = (double *)infinity();
    if (-*pdVar3 < dVar1) {
      poVar2 = std::operator<<(in_RSI," >= ");
      std::ostream::operator<<(poVar2,*in_R8);
    }
    else {
      poVar2 = std::operator<<(in_RSI," <= ");
      std::ostream::operator<<(poVar2,*in_R9);
    }
  }
  else {
    poVar2 = std::operator<<(in_RSI," = ");
    std::ostream::operator<<(poVar2,*in_R9);
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<R>&   p_lp,       ///< the LP
   std::ostream&         p_output,   ///< output stream
   const NameSet*        p_cnames,   ///< column names
   const SVectorBase<R>& p_svec,     ///< vector of the row
   const R&              p_lhs,      ///< lhs of the row
   const R&              p_rhs       ///< rhs of the row
)
{

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec);

   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(p_lhs <= R(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(p_rhs >= R(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";
}